

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeNullConstant(Builder *this,Id typeId)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  Instruction *pIVar3;
  iterator __position;
  Id IVar4;
  uint uVar5;
  ulong uVar6;
  Instruction *c;
  Instruction *local_28;
  _Head_base<0UL,_spv::Instruction_*,_false> local_20;
  
  ppIVar2 = (this->nullConstants).
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(this->nullConstants).
                               super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3);
  if ((int)uVar5 < 1) {
    IVar4 = 0;
  }
  else {
    uVar6 = 0;
    IVar4 = 0;
    do {
      pIVar3 = ppIVar2[uVar6];
      if (pIVar3->typeId == typeId) {
        IVar4 = pIVar3->resultId;
      }
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  if (IVar4 == 0) {
    local_28 = (Instruction *)operator_new(0x60);
    IVar4 = this->uniqueId + 1;
    this->uniqueId = IVar4;
    local_28->_vptr_Instruction = (_func_int **)&PTR__Instruction_0093fd28;
    local_28->resultId = IVar4;
    local_28->typeId = typeId;
    local_28->opCode = OpConstantNull;
    (local_28->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (local_28->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    (local_28->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_28->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_28->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (local_28->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (local_28->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    (local_28->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    local_28->block = (Block *)0x0;
    local_20._M_head_impl = local_28;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_20);
    if (local_20._M_head_impl != (Instruction *)0x0) {
      (*(local_20._M_head_impl)->_vptr_Instruction[1])();
    }
    __position._M_current =
         (this->nullConstants).
         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->nullConstants).
        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Instruction*,std::allocator<spv::Instruction*>>::
      _M_realloc_insert<spv::Instruction*const&>
                ((vector<spv::Instruction*,std::allocator<spv::Instruction*>> *)&this->nullConstants
                 ,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      pppIVar1 = &(this->nullConstants).
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
    Module::mapInstruction(&this->module,local_28);
    IVar4 = local_28->resultId;
  }
  return IVar4;
}

Assistant:

Id Builder::makeNullConstant(Id typeId)
{
    Instruction* constant;

    // See if we already made it.
    Id existing = NoResult;
    for (int i = 0; i < (int)nullConstants.size(); ++i) {
        constant = nullConstants[i];
        if (constant->getTypeId() == typeId)
            existing = constant->getResultId();
    }

    if (existing != NoResult)
        return existing;

    // Make it
    Instruction* c = new Instruction(getUniqueId(), typeId, OpConstantNull);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    nullConstants.push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}